

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eimgfs.cpp
# Opt level: O1

void __thiscall exe_reconstructor::printexe(exe_reconstructor *this)

{
  o32rom *this_00;
  pointer psVar1;
  pointer psVar2;
  uint uVar3;
  ulong uVar4;
  sectioninfo_ptr local_48;
  
  e32rom::printe32((this->_e32rom).
                   super___shared_ptr<exe_reconstructor::e32rom,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
  ;
  if ((long)(this->_sections).
            super__Vector_base<std::shared_ptr<exe_reconstructor::sectioninfo>,_std::allocator<std::shared_ptr<exe_reconstructor::sectioninfo>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)(this->_sections).
            super__Vector_base<std::shared_ptr<exe_reconstructor::sectioninfo>,_std::allocator<std::shared_ptr<exe_reconstructor::sectioninfo>_>_>
            ._M_impl.super__Vector_impl_data._M_start >> 4 !=
      (long)(this->_o32rom).
            super__Vector_base<std::shared_ptr<exe_reconstructor::o32rom>,_std::allocator<std::shared_ptr<exe_reconstructor::o32rom>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)(this->_o32rom).
            super__Vector_base<std::shared_ptr<exe_reconstructor::o32rom>,_std::allocator<std::shared_ptr<exe_reconstructor::o32rom>_>_>
            ._M_impl.super__Vector_impl_data._M_start >> 4) {
    printf("WARNING: #sections=%d, #o32=%d\n");
  }
  psVar2 = (this->_o32rom).
           super__Vector_base<std::shared_ptr<exe_reconstructor::o32rom>,_std::allocator<std::shared_ptr<exe_reconstructor::o32rom>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->_o32rom).
      super__Vector_base<std::shared_ptr<exe_reconstructor::o32rom>,_std::allocator<std::shared_ptr<exe_reconstructor::o32rom>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != psVar2) {
    uVar3 = 1;
    uVar4 = 0;
    do {
      this_00 = psVar2[uVar4].
                super___shared_ptr<exe_reconstructor::o32rom,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      psVar1 = (this->_sections).
               super__Vector_base<std::shared_ptr<exe_reconstructor::sectioninfo>,_std::allocator<std::shared_ptr<exe_reconstructor::sectioninfo>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (uVar4 < (ulong)((long)(this->_sections).
                                super__Vector_base<std::shared_ptr<exe_reconstructor::sectioninfo>,_std::allocator<std::shared_ptr<exe_reconstructor::sectioninfo>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)psVar1 >> 4)) {
        local_48.super___shared_ptr<exe_reconstructor::sectioninfo,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = psVar1[uVar4].
                 super___shared_ptr<exe_reconstructor::sectioninfo,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        local_48.super___shared_ptr<exe_reconstructor::sectioninfo,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi =
             psVar1[uVar4].
             super___shared_ptr<exe_reconstructor::sectioninfo,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
        if (local_48.super___shared_ptr<exe_reconstructor::sectioninfo,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_48.super___shared_ptr<exe_reconstructor::sectioninfo,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi)->_M_use_count =
                 (local_48.
                  super___shared_ptr<exe_reconstructor::sectioninfo,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_48.super___shared_ptr<exe_reconstructor::sectioninfo,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi)->_M_use_count =
                 (local_48.
                  super___shared_ptr<exe_reconstructor::sectioninfo,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
          }
        }
      }
      else {
        local_48.super___shared_ptr<exe_reconstructor::sectioninfo,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = (element_type *)0x0;
        local_48.super___shared_ptr<exe_reconstructor::sectioninfo,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      }
      o32rom::printo32(this_00,&local_48);
      if (local_48.super___shared_ptr<exe_reconstructor::sectioninfo,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_48.
                   super___shared_ptr<exe_reconstructor::sectioninfo,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      uVar4 = (ulong)uVar3;
      psVar2 = (this->_o32rom).
               super__Vector_base<std::shared_ptr<exe_reconstructor::o32rom>,_std::allocator<std::shared_ptr<exe_reconstructor::o32rom>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar3 = uVar3 + 1;
    } while (uVar4 < (ulong)((long)(this->_o32rom).
                                   super__Vector_base<std::shared_ptr<exe_reconstructor::o32rom>,_std::allocator<std::shared_ptr<exe_reconstructor::o32rom>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)psVar2 >> 4));
  }
  return;
}

Assistant:

void printexe() const
    {
        _e32rom->printe32();
        if (_sections.size() != _o32rom.size())
            printf("WARNING: #sections=%d, #o32=%d\n", (int)_sections.size(), (int)_o32rom.size());
        for (unsigned i= 0 ; i<_o32rom.size() ; i++) 
            _o32rom[i]->printo32(i<_sections.size() ? _sections[i] : sectioninfo_ptr());
    }